

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * makeTempDir_abi_cxx11_(void)

{
  size_t __n;
  char *pcVar1;
  int *piVar2;
  ostream *poVar3;
  ulong uVar4;
  string *in_RDI;
  int status;
  char *tmpd;
  size_t tlen;
  char *tmpdirname;
  char tmpbuf [4096];
  int trycount;
  string *tempDir;
  char local_1018 [4104];
  undefined4 local_10;
  undefined1 local_9;
  
  local_9 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_10 = 0;
  memset(local_1018,0,0x1000);
  __n = strlen("/var/tmp/OpenEXR_XXXXXX");
  memcpy(local_1018,"/var/tmp/OpenEXR_XXXXXX",__n);
  pcVar1 = mkdtemp(local_1018);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)in_RDI,pcVar1);
    std::__cxx11::string::operator+=((string *)in_RDI,"/");
    poVar3 = std::operator<<((ostream *)&std::cout,"tempDir = \'");
    poVar3 = std::operator<<(poVar3,(string *)in_RDI);
    poVar3 = std::operator<<(poVar3,"\': ");
    uVar4 = std::__cxx11::string::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return in_RDI;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: mkdtemp( \"");
  poVar3 = std::operator<<(poVar3,local_1018);
  poVar3 = std::operator<<(poVar3,"\" failed: ");
  piVar2 = __errno_location();
  pcVar1 = strerror(*piVar2);
  poVar3 = std::operator<<(poVar3,pcVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

std::string
makeTempDir ()
{
    std::string tempDir;
    for (int trycount = 0; trycount < 3; ++trycount)
    {
#ifdef _WIN32
        IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
        char                    tmpbuf[4096];
        DWORD                   len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            std::cerr << "Cannot retrieve temporary directory" << std::endl;
            exit (1);
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";

        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        int status = _mkdir (tempDir.c_str ());

        if (status != 0)
        {
            std::cerr << "ERROR -- mkdir(" << tempDir
                      << ") failed: "
                         "errno = "
                      << errno << std::endl;
            if (errno == EEXIST) continue;
            if (trycount == 2) exit (1);
        }
#else
        char tmpbuf[4096];

        memset (tmpbuf, 0, 4096);
        const char* tmpdirname = IMF_TMP_DIR "OpenEXR_XXXXXX";
        size_t      tlen       = strlen (tmpdirname);
        memcpy (tmpbuf, tmpdirname, tlen);

        char* tmpd = mkdtemp (tmpbuf);
        if (tmpd) { tempDir = tmpd; }
        else
        {
            std::cerr << "ERROR: mkdtemp( \"" << tmpbuf
                      << "\" failed: " << strerror (errno) << std::endl;
            exit (1);
        }
        int status = 0;
#endif
        if (status == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;

            std::cout << "tempDir = '" << tempDir << "': " << tempDir.size ()
                      << std::endl;
            break; // success
        }
    }

    return tempDir;
}